

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  RTCIntersectArguments *pRVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  bool bVar29;
  undefined1 auVar30 [16];
  AABBNodeMB4D *node1;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong unaff_R12;
  size_t mask;
  size_t sVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  ulong uVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar58;
  float fVar67;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar65 [32];
  undefined8 extraout_XMM1_Qa_00;
  float fVar68;
  undefined1 auVar66 [64];
  float fVar69;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar70;
  float fVar83;
  float fVar84;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar85;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar91;
  undefined1 auVar90 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  float fVar96;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar97 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  float fVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar106 [64];
  float fVar110;
  undefined1 auVar111 [16];
  float fVar113;
  uint uVar114;
  float fVar115;
  uint uVar116;
  float fVar117;
  uint uVar118;
  undefined1 auVar112 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  float fVar130;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar127 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  int local_150c;
  undefined1 local_1508 [8];
  float fStack_1500;
  float fStack_14fc;
  undefined1 local_14f8 [8];
  float fStack_14f0;
  float fStack_14ec;
  undefined1 local_14e8 [16];
  ulong local_14d0;
  ulong local_14c8;
  ulong local_14c0;
  ulong local_14b8;
  ulong local_14b0;
  ulong local_14a8;
  ulong local_14a0;
  NodeRef *local_1498;
  Scene *scene;
  undefined1 local_1488 [8];
  undefined8 uStack_1480;
  undefined1 local_1478 [8];
  float fStack_1470;
  float fStack_146c;
  undefined1 local_1468 [8];
  float fStack_1460;
  float fStack_145c;
  ulong local_1458;
  ulong local_1450;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float local_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  auVar30 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar58 = ray->tfar;
    auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar58) {
      local_1498 = stack + 1;
      aVar5 = (ray->dir).field_0;
      auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar51._8_4_ = 0x7fffffff;
      auVar51._0_8_ = 0x7fffffff7fffffff;
      auVar51._12_4_ = 0x7fffffff;
      auVar51 = vandps_avx((undefined1  [16])aVar5,auVar51);
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      auVar51 = vcmpps_avx(auVar51,auVar92,1);
      auVar51 = vblendvps_avx((undefined1  [16])aVar5,auVar92,auVar51);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar92 = vrcpps_avx(auVar51);
      fVar67 = auVar92._0_4_;
      auVar71._0_4_ = fVar67 * auVar51._0_4_;
      fVar68 = auVar92._4_4_;
      auVar71._4_4_ = fVar68 * auVar51._4_4_;
      fVar69 = auVar92._8_4_;
      auVar71._8_4_ = fVar69 * auVar51._8_4_;
      fVar91 = auVar92._12_4_;
      auVar71._12_4_ = fVar91 * auVar51._12_4_;
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = &DAT_3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar51 = vsubps_avx(auVar93,auVar71);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar4;
      local_11f8._0_4_ = uVar4;
      local_11f8._8_4_ = uVar4;
      local_11f8._12_4_ = uVar4;
      local_11f8._16_4_ = uVar4;
      local_11f8._20_4_ = uVar4;
      local_11f8._24_4_ = uVar4;
      local_11f8._28_4_ = uVar4;
      auVar103 = ZEXT3264(local_11f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar4;
      local_1218._0_4_ = uVar4;
      local_1218._8_4_ = uVar4;
      local_1218._12_4_ = uVar4;
      local_1218._16_4_ = uVar4;
      local_1218._20_4_ = uVar4;
      local_1218._24_4_ = uVar4;
      local_1218._28_4_ = uVar4;
      auVar104 = ZEXT3264(local_1218);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar4;
      local_1238._0_4_ = uVar4;
      local_1238._8_4_ = uVar4;
      local_1238._12_4_ = uVar4;
      local_1238._16_4_ = uVar4;
      local_1238._20_4_ = uVar4;
      local_1238._24_4_ = uVar4;
      local_1238._28_4_ = uVar4;
      auVar106 = ZEXT3264(local_1238);
      auVar72._0_4_ = fVar67 + fVar67 * auVar51._0_4_;
      auVar72._4_4_ = fVar68 + fVar68 * auVar51._4_4_;
      auVar72._8_4_ = fVar69 + fVar69 * auVar51._8_4_;
      auVar72._12_4_ = fVar91 + fVar91 * auVar51._12_4_;
      auVar51 = vshufps_avx(auVar72,auVar72,0);
      local_1258._16_16_ = auVar51;
      local_1258._0_16_ = auVar51;
      auVar112 = ZEXT3264(local_1258);
      auVar51 = vmovshdup_avx(auVar72);
      auVar90 = ZEXT1664(auVar51);
      auVar92 = vshufps_avx(auVar72,auVar72,0x55);
      local_1278._16_16_ = auVar92;
      local_1278._0_16_ = auVar92;
      auVar120 = ZEXT3264(local_1278);
      auVar92 = vshufpd_avx(auVar72,auVar72,1);
      auVar95 = ZEXT1664(auVar92);
      auVar71 = vshufps_avx(auVar72,auVar72,0xaa);
      auVar82 = ZEXT1664(auVar71);
      uVar45 = (ulong)(auVar72._0_4_ < 0.0) << 5;
      local_1298._16_16_ = auVar71;
      local_1298._0_16_ = auVar71;
      auVar122 = ZEXT3264(local_1298);
      uVar39 = (ulong)(auVar51._0_4_ < 0.0) << 5 | 0x40;
      uVar40 = (ulong)(auVar92._0_4_ < 0.0) << 5 | 0x80;
      uVar42 = uVar45 ^ 0x20;
      uVar36 = uVar39 ^ 0x20;
      uVar46 = uVar40 ^ 0x20;
      auVar51 = vshufps_avx(auVar54,auVar54,0);
      auVar66 = ZEXT1664(auVar51);
      local_12b8._16_16_ = auVar51;
      local_12b8._0_16_ = auVar51;
      auVar124 = ZEXT3264(local_12b8);
      auVar51 = vshufps_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),0);
      local_12d8._16_16_ = auVar51;
      local_12d8._0_16_ = auVar51;
      auVar127 = ZEXT3264(local_12d8);
      local_14a8 = uVar45;
      local_14b0 = uVar39;
      local_14b8 = uVar40;
      local_14c0 = uVar42;
      local_14c8 = uVar36;
      local_14d0 = uVar46;
      do {
        if (local_1498 == stack) {
          return;
        }
        sVar44 = local_1498[-1].ptr;
        local_1498 = local_1498 + -1;
        local_14a0 = unaff_R12;
        do {
          if ((sVar44 & 8) == 0) {
            uVar31 = sVar44 & 0xfffffffffffffff0;
            fVar58 = (ray->dir).field_0.m128[3];
            auVar57._4_4_ = fVar58;
            auVar57._0_4_ = fVar58;
            auVar57._8_4_ = fVar58;
            auVar57._12_4_ = fVar58;
            auVar57._16_4_ = fVar58;
            auVar57._20_4_ = fVar58;
            auVar57._24_4_ = fVar58;
            auVar57._28_4_ = fVar58;
            pfVar3 = (float *)(uVar31 + 0x100 + uVar45);
            pfVar1 = (float *)(uVar31 + 0x40 + uVar45);
            auVar65._0_4_ = fVar58 * *pfVar3 + *pfVar1;
            auVar65._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
            auVar65._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
            auVar65._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
            auVar65._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
            auVar65._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
            auVar65._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
            auVar65._28_4_ = auVar66._28_4_ + pfVar1[7];
            auVar65 = vsubps_avx(auVar65,auVar103._0_32_);
            auVar23._4_4_ = auVar112._4_4_ * auVar65._4_4_;
            auVar23._0_4_ = auVar112._0_4_ * auVar65._0_4_;
            auVar23._8_4_ = auVar112._8_4_ * auVar65._8_4_;
            auVar23._12_4_ = auVar112._12_4_ * auVar65._12_4_;
            auVar23._16_4_ = auVar112._16_4_ * auVar65._16_4_;
            auVar23._20_4_ = auVar112._20_4_ * auVar65._20_4_;
            auVar23._24_4_ = auVar112._24_4_ * auVar65._24_4_;
            auVar23._28_4_ = auVar65._28_4_;
            pfVar3 = (float *)(uVar31 + 0x100 + uVar39);
            pfVar1 = (float *)(uVar31 + 0x40 + uVar39);
            auVar80._0_4_ = fVar58 * *pfVar3 + *pfVar1;
            auVar80._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
            auVar80._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
            auVar80._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
            auVar80._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
            auVar80._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
            auVar80._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
            auVar80._28_4_ = auVar82._28_4_ + pfVar1[7];
            auVar65 = vmaxps_avx(auVar124._0_32_,auVar23);
            auVar23 = vsubps_avx(auVar80,auVar104._0_32_);
            pfVar3 = (float *)(uVar31 + 0x100 + uVar40);
            auVar24._4_4_ = auVar120._4_4_ * auVar23._4_4_;
            auVar24._0_4_ = auVar120._0_4_ * auVar23._0_4_;
            auVar24._8_4_ = auVar120._8_4_ * auVar23._8_4_;
            auVar24._12_4_ = auVar120._12_4_ * auVar23._12_4_;
            auVar24._16_4_ = auVar120._16_4_ * auVar23._16_4_;
            auVar24._20_4_ = auVar120._20_4_ * auVar23._20_4_;
            auVar24._24_4_ = auVar120._24_4_ * auVar23._24_4_;
            auVar24._28_4_ = auVar23._28_4_;
            pfVar1 = (float *)(uVar31 + 0x40 + uVar40);
            auVar88._0_4_ = fVar58 * *pfVar3 + *pfVar1;
            auVar88._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
            auVar88._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
            auVar88._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
            auVar88._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
            auVar88._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
            auVar88._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
            auVar88._28_4_ = auVar90._28_4_ + pfVar1[7];
            auVar23 = vsubps_avx(auVar88,auVar106._0_32_);
            auVar25._4_4_ = auVar122._4_4_ * auVar23._4_4_;
            auVar25._0_4_ = auVar122._0_4_ * auVar23._0_4_;
            auVar25._8_4_ = auVar122._8_4_ * auVar23._8_4_;
            auVar25._12_4_ = auVar122._12_4_ * auVar23._12_4_;
            auVar25._16_4_ = auVar122._16_4_ * auVar23._16_4_;
            auVar25._20_4_ = auVar122._20_4_ * auVar23._20_4_;
            fVar67 = auVar23._28_4_;
            auVar25._24_4_ = auVar122._24_4_ * auVar23._24_4_;
            auVar25._28_4_ = fVar67;
            auVar23 = vmaxps_avx(auVar24,auVar25);
            pfVar3 = (float *)(uVar31 + 0x100 + uVar42);
            auVar65 = vmaxps_avx(auVar65,auVar23);
            pfVar1 = (float *)(uVar31 + 0x40 + uVar42);
            auVar81._0_4_ = fVar58 * *pfVar3 + *pfVar1;
            auVar81._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
            auVar81._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
            auVar81._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
            auVar81._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
            auVar81._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
            auVar81._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
            auVar81._28_4_ = fVar67 + pfVar1[7];
            auVar23 = vsubps_avx(auVar81,auVar103._0_32_);
            auVar26._4_4_ = auVar112._4_4_ * auVar23._4_4_;
            auVar26._0_4_ = auVar112._0_4_ * auVar23._0_4_;
            auVar26._8_4_ = auVar112._8_4_ * auVar23._8_4_;
            auVar26._12_4_ = auVar112._12_4_ * auVar23._12_4_;
            auVar26._16_4_ = auVar112._16_4_ * auVar23._16_4_;
            auVar26._20_4_ = auVar112._20_4_ * auVar23._20_4_;
            auVar26._24_4_ = auVar112._24_4_ * auVar23._24_4_;
            auVar26._28_4_ = auVar23._28_4_;
            auVar23 = vminps_avx(auVar127._0_32_,auVar26);
            pfVar3 = (float *)(uVar31 + 0x100 + uVar36);
            pfVar1 = (float *)(uVar31 + 0x40 + uVar36);
            auVar89._0_4_ = fVar58 * *pfVar3 + *pfVar1;
            auVar89._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
            auVar89._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
            auVar89._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
            auVar89._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
            auVar89._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
            auVar89._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
            auVar89._28_4_ = fVar67 + pfVar1[7];
            auVar24 = vsubps_avx(auVar89,auVar104._0_32_);
            auVar27._4_4_ = auVar120._4_4_ * auVar24._4_4_;
            auVar27._0_4_ = auVar120._0_4_ * auVar24._0_4_;
            auVar27._8_4_ = auVar120._8_4_ * auVar24._8_4_;
            auVar27._12_4_ = auVar120._12_4_ * auVar24._12_4_;
            auVar27._16_4_ = auVar120._16_4_ * auVar24._16_4_;
            auVar27._20_4_ = auVar120._20_4_ * auVar24._20_4_;
            auVar27._24_4_ = auVar120._24_4_ * auVar24._24_4_;
            auVar27._28_4_ = auVar24._28_4_;
            pfVar3 = (float *)(uVar31 + 0x100 + uVar46);
            pfVar1 = (float *)(uVar31 + 0x40 + uVar46);
            auVar94._0_4_ = fVar58 * *pfVar3 + *pfVar1;
            auVar94._4_4_ = fVar58 * pfVar3[1] + pfVar1[1];
            auVar94._8_4_ = fVar58 * pfVar3[2] + pfVar1[2];
            auVar94._12_4_ = fVar58 * pfVar3[3] + pfVar1[3];
            auVar94._16_4_ = fVar58 * pfVar3[4] + pfVar1[4];
            auVar94._20_4_ = fVar58 * pfVar3[5] + pfVar1[5];
            auVar94._24_4_ = fVar58 * pfVar3[6] + pfVar1[6];
            auVar94._28_4_ = auVar95._28_4_ + pfVar1[7];
            auVar24 = vsubps_avx(auVar94,auVar106._0_32_);
            auVar28._4_4_ = auVar122._4_4_ * auVar24._4_4_;
            auVar28._0_4_ = auVar122._0_4_ * auVar24._0_4_;
            auVar28._8_4_ = auVar122._8_4_ * auVar24._8_4_;
            auVar28._12_4_ = auVar122._12_4_ * auVar24._12_4_;
            auVar28._16_4_ = auVar122._16_4_ * auVar24._16_4_;
            auVar28._20_4_ = auVar122._20_4_ * auVar24._20_4_;
            auVar28._24_4_ = auVar122._24_4_ * auVar24._24_4_;
            auVar28._28_4_ = auVar24._28_4_;
            auVar95 = ZEXT3264(auVar28);
            auVar24 = vminps_avx(auVar27,auVar28);
            auVar90 = ZEXT3264(auVar24);
            auVar23 = vminps_avx(auVar23,auVar24);
            auVar65 = vcmpps_avx(auVar65,auVar23,2);
            auVar66 = ZEXT3264(auVar65);
            if (((uint)sVar44 & 7) == 6) {
              auVar23 = vcmpps_avx(*(undefined1 (*) [32])(uVar31 + 0x1c0),auVar57,2);
              auVar24 = vcmpps_avx(auVar57,*(undefined1 (*) [32])(uVar31 + 0x1e0),1);
              auVar24 = vandps_avx(auVar23,auVar24);
              auVar65 = vandps_avx(auVar24,auVar65);
              auVar66 = ZEXT1664(auVar65._16_16_);
              auVar51 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
            }
            else {
              auVar51 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
            }
            auVar82 = ZEXT3264(auVar23);
            auVar51 = vpsllw_avx(auVar51,0xf);
            auVar51 = vpacksswb_avx(auVar51,auVar51);
            local_14a0 = (ulong)(byte)(SUB161(auVar51 >> 7,0) & 1 |
                                       (SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar51 >> 0x3f,0) << 7);
          }
          if ((sVar44 & 8) == 0) {
            if (local_14a0 == 0) {
              iVar37 = 4;
            }
            else {
              uVar31 = sVar44 & 0xfffffffffffffff0;
              lVar34 = 0;
              if (local_14a0 != 0) {
                for (; (local_14a0 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                }
              }
              iVar37 = 0;
              sVar44 = *(size_t *)(uVar31 + lVar34 * 8);
              uVar35 = local_14a0 - 1 & local_14a0;
              if (uVar35 != 0) {
                local_1498->ptr = sVar44;
                lVar34 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                  }
                }
                uVar32 = uVar35 - 1;
                while( true ) {
                  local_1498 = local_1498 + 1;
                  sVar44 = *(size_t *)(uVar31 + lVar34 * 8);
                  uVar32 = uVar32 & uVar35;
                  if (uVar32 == 0) break;
                  local_1498->ptr = sVar44;
                  lVar34 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                    }
                  }
                  uVar35 = uVar32 - 1;
                }
              }
            }
          }
          else {
            iVar37 = 6;
          }
        } while (iVar37 == 0);
        if (iVar37 == 6) {
          iVar37 = 0;
          local_1458 = (ulong)((uint)sVar44 & 0xf) - 8;
          bVar50 = local_1458 != 0;
          if (bVar50) {
            uVar45 = sVar44 & 0xfffffffffffffff0;
            scene = context->scene;
            uVar36 = 0;
            do {
              local_1450 = uVar36;
              lVar33 = uVar36 * 0x50;
              pGVar6 = (scene->geometries).items[*(uint *)(uVar45 + 0x30 + lVar33)].ptr;
              fVar58 = (pGVar6->time_range).lower;
              fVar58 = pGVar6->fnumTimeSegments *
                       (((ray->dir).field_0.m128[3] - fVar58) /
                       ((pGVar6->time_range).upper - fVar58));
              auVar51 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),9);
              auVar51 = vminss_avx(auVar51,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
              auVar62 = vmaxss_avx(auVar97._0_16_,auVar51);
              lVar38 = (long)(int)auVar62._0_4_ * 0x38;
              uVar39 = (ulong)*(uint *)(uVar45 + 4 + lVar33);
              lVar34 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar38);
              lVar38 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar38);
              auVar51 = *(undefined1 (*) [16])(lVar34 + (ulong)*(uint *)(uVar45 + lVar33) * 4);
              uVar49 = (ulong)*(uint *)(uVar45 + 0x10 + lVar33);
              auVar54 = *(undefined1 (*) [16])(lVar34 + uVar49 * 4);
              uVar42 = (ulong)*(uint *)(uVar45 + 0x20 + lVar33);
              auVar75 = *(undefined1 (*) [16])(lVar34 + uVar42 * 4);
              auVar92 = *(undefined1 (*) [16])(lVar34 + uVar39 * 4);
              uVar31 = (ulong)*(uint *)(uVar45 + 0x14 + lVar33);
              auVar71 = *(undefined1 (*) [16])(lVar34 + uVar31 * 4);
              uVar46 = (ulong)*(uint *)(uVar45 + 0x24 + lVar33);
              auVar76 = *(undefined1 (*) [16])(lVar34 + uVar46 * 4);
              uVar40 = (ulong)*(uint *)(uVar45 + 8 + lVar33);
              auVar72 = *(undefined1 (*) [16])(lVar34 + uVar40 * 4);
              uVar41 = (ulong)*(uint *)(uVar45 + 0x18 + lVar33);
              auVar93 = *(undefined1 (*) [16])(lVar34 + uVar41 * 4);
              uVar35 = (ulong)*(uint *)(uVar45 + 0x28 + lVar33);
              auVar52 = *(undefined1 (*) [16])(lVar34 + uVar35 * 4);
              uVar47 = (ulong)*(uint *)(uVar45 + 0xc + lVar33);
              auVar53 = *(undefined1 (*) [16])(lVar34 + uVar47 * 4);
              uVar43 = (ulong)*(uint *)(uVar45 + 0x1c + lVar33);
              auVar55 = *(undefined1 (*) [16])(lVar34 + uVar43 * 4);
              uVar32 = (ulong)*(uint *)(uVar45 + 0x2c + lVar33);
              auVar60 = *(undefined1 (*) [16])(lVar34 + uVar32 * 4);
              auVar59 = *(undefined1 (*) [16])(lVar38 + (ulong)*(uint *)(uVar45 + lVar33) * 4);
              auVar61 = *(undefined1 (*) [16])(lVar38 + uVar49 * 4);
              fVar58 = fVar58 - auVar62._0_4_;
              auVar62 = vunpcklps_avx(auVar51,auVar72);
              auVar72 = vunpckhps_avx(auVar51,auVar72);
              auVar63 = vunpcklps_avx(auVar92,auVar53);
              auVar92 = vunpckhps_avx(auVar92,auVar53);
              auVar51 = *(undefined1 (*) [16])(lVar38 + uVar39 * 4);
              auVar73 = vunpcklps_avx(auVar72,auVar92);
              auVar74 = vunpcklps_avx(auVar62,auVar63);
              auVar72 = vunpckhps_avx(auVar62,auVar63);
              auVar53 = vunpcklps_avx(auVar54,auVar93);
              auVar92 = vunpckhps_avx(auVar54,auVar93);
              auVar93 = vunpcklps_avx(auVar71,auVar55);
              auVar71 = vunpckhps_avx(auVar71,auVar55);
              auVar54 = *(undefined1 (*) [16])(lVar38 + uVar40 * 4);
              auVar55 = vunpcklps_avx(auVar92,auVar71);
              auVar62 = vunpcklps_avx(auVar53,auVar93);
              auVar71 = vunpckhps_avx(auVar53,auVar93);
              auVar53 = vunpcklps_avx(auVar75,auVar52);
              auVar93 = vunpckhps_avx(auVar75,auVar52);
              auVar63 = vunpcklps_avx(auVar76,auVar60);
              auVar52 = vunpckhps_avx(auVar76,auVar60);
              auVar92 = *(undefined1 (*) [16])(lVar38 + uVar47 * 4);
              auVar60 = vunpcklps_avx(auVar93,auVar52);
              auVar75 = vunpcklps_avx(auVar53,auVar63);
              auVar93 = vunpckhps_avx(auVar53,auVar63);
              auVar52 = vunpcklps_avx(auVar59,auVar54);
              auVar54 = vunpckhps_avx(auVar59,auVar54);
              auVar53 = vunpcklps_avx(auVar51,auVar92);
              auVar92 = vunpckhps_avx(auVar51,auVar92);
              auVar51 = *(undefined1 (*) [16])(lVar38 + uVar41 * 4);
              auVar59 = vunpcklps_avx(auVar54,auVar92);
              auVar63 = vunpcklps_avx(auVar52,auVar53);
              auVar92 = vunpckhps_avx(auVar52,auVar53);
              auVar53 = vunpcklps_avx(auVar61,auVar51);
              auVar52 = vunpckhps_avx(auVar61,auVar51);
              auVar51 = *(undefined1 (*) [16])(lVar38 + uVar31 * 4);
              auVar54 = *(undefined1 (*) [16])(lVar38 + uVar43 * 4);
              auVar61 = vunpcklps_avx(auVar51,auVar54);
              auVar51 = vunpckhps_avx(auVar51,auVar54);
              auVar76 = vunpcklps_avx(auVar52,auVar51);
              auVar77 = vunpcklps_avx(auVar53,auVar61);
              auVar52 = vunpckhps_avx(auVar53,auVar61);
              auVar51 = *(undefined1 (*) [16])(lVar38 + uVar42 * 4);
              auVar54 = *(undefined1 (*) [16])(lVar38 + uVar35 * 4);
              auVar61 = vunpcklps_avx(auVar51,auVar54);
              auVar53 = vunpckhps_avx(auVar51,auVar54);
              auVar51 = *(undefined1 (*) [16])(lVar38 + uVar46 * 4);
              auVar54 = *(undefined1 (*) [16])(lVar38 + uVar32 * 4);
              auVar78 = vunpcklps_avx(auVar51,auVar54);
              auVar51 = vunpckhps_avx(auVar51,auVar54);
              auVar86 = vunpcklps_avx(auVar53,auVar51);
              auVar102 = vunpcklps_avx(auVar61,auVar78);
              auVar53 = vunpckhps_avx(auVar61,auVar78);
              auVar51 = vshufps_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),0);
              auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar58)),ZEXT416((uint)(1.0 - fVar58)),0);
              fVar58 = auVar51._0_4_;
              fVar67 = auVar51._4_4_;
              fVar68 = auVar51._8_4_;
              fVar69 = auVar51._12_4_;
              fVar91 = auVar54._0_4_;
              fVar128 = auVar54._4_4_;
              fVar129 = auVar54._8_4_;
              fVar130 = auVar54._12_4_;
              auVar123._0_4_ = fVar91 * auVar74._0_4_ + fVar58 * auVar63._0_4_;
              auVar123._4_4_ = fVar128 * auVar74._4_4_ + fVar67 * auVar63._4_4_;
              auVar123._8_4_ = fVar129 * auVar74._8_4_ + fVar68 * auVar63._8_4_;
              auVar123._12_4_ = fVar130 * auVar74._12_4_ + fVar69 * auVar63._12_4_;
              local_1478._0_4_ = auVar72._0_4_;
              local_1478._4_4_ = auVar72._4_4_;
              fStack_1470 = auVar72._8_4_;
              fStack_146c = auVar72._12_4_;
              local_1478._0_4_ = fVar91 * (float)local_1478._0_4_ + fVar58 * auVar92._0_4_;
              local_1478._4_4_ = fVar128 * (float)local_1478._4_4_ + fVar67 * auVar92._4_4_;
              fStack_1470 = fVar129 * fStack_1470 + fVar68 * auVar92._8_4_;
              fStack_146c = fVar130 * fStack_146c + fVar69 * auVar92._12_4_;
              local_13c8 = auVar73._0_4_;
              fStack_13c4 = auVar73._4_4_;
              fStack_13c0 = auVar73._8_4_;
              fStack_13bc = auVar73._12_4_;
              auVar101._0_4_ = fVar91 * local_13c8 + fVar58 * auVar59._0_4_;
              auVar101._4_4_ = fVar128 * fStack_13c4 + fVar67 * auVar59._4_4_;
              auVar101._8_4_ = fVar129 * fStack_13c0 + fVar68 * auVar59._8_4_;
              auVar101._12_4_ = fVar130 * fStack_13bc + fVar69 * auVar59._12_4_;
              auVar59._0_4_ = fVar91 * auVar62._0_4_ + fVar58 * auVar77._0_4_;
              auVar59._4_4_ = fVar128 * auVar62._4_4_ + fVar67 * auVar77._4_4_;
              auVar59._8_4_ = fVar129 * auVar62._8_4_ + fVar68 * auVar77._8_4_;
              auVar59._12_4_ = fVar130 * auVar62._12_4_ + fVar69 * auVar77._12_4_;
              local_13d8 = auVar71._0_4_;
              fStack_13d4 = auVar71._4_4_;
              fStack_13d0 = auVar71._8_4_;
              fStack_13cc = auVar71._12_4_;
              auVar73._0_4_ = fVar91 * local_13d8 + fVar58 * auVar52._0_4_;
              auVar73._4_4_ = fVar128 * fStack_13d4 + fVar67 * auVar52._4_4_;
              auVar73._8_4_ = fVar129 * fStack_13d0 + fVar68 * auVar52._8_4_;
              auVar73._12_4_ = fVar130 * fStack_13cc + fVar69 * auVar52._12_4_;
              puVar2 = (undefined8 *)(uVar45 + 0x30 + lVar33);
              local_13a8 = *puVar2;
              uStack_13a0 = puVar2[1];
              puVar2 = (undefined8 *)(uVar45 + 0x40 + lVar33);
              local_1488._0_4_ = auVar55._0_4_;
              local_1488._4_4_ = auVar55._4_4_;
              uStack_1480._0_4_ = auVar55._8_4_;
              uStack_1480._4_4_ = auVar55._12_4_;
              auVar111._0_4_ = fVar91 * (float)local_1488._0_4_ + auVar76._0_4_ * fVar58;
              auVar111._4_4_ = fVar128 * (float)local_1488._4_4_ + auVar76._4_4_ * fVar67;
              auVar111._8_4_ = fVar129 * (float)uStack_1480 + auVar76._8_4_ * fVar68;
              auVar111._12_4_ = fVar130 * uStack_1480._4_4_ + auVar76._12_4_ * fVar69;
              local_1468._0_4_ = auVar75._0_4_;
              local_1468._4_4_ = auVar75._4_4_;
              fStack_1460 = auVar75._8_4_;
              fStack_145c = auVar75._12_4_;
              auVar119._0_4_ = fVar91 * (float)local_1468._0_4_ + auVar102._0_4_ * fVar58;
              auVar119._4_4_ = fVar128 * (float)local_1468._4_4_ + auVar102._4_4_ * fVar67;
              auVar119._8_4_ = fVar129 * fStack_1460 + auVar102._8_4_ * fVar68;
              auVar119._12_4_ = fVar130 * fStack_145c + auVar102._12_4_ * fVar69;
              local_1508._0_4_ = auVar93._0_4_;
              local_1508._4_4_ = auVar93._4_4_;
              fStack_1500 = auVar93._8_4_;
              fStack_14fc = auVar93._12_4_;
              auVar121._0_4_ = auVar53._0_4_ * fVar58 + fVar91 * (float)local_1508._0_4_;
              auVar121._4_4_ = auVar53._4_4_ * fVar67 + fVar128 * (float)local_1508._4_4_;
              auVar121._8_4_ = auVar53._8_4_ * fVar68 + fVar129 * fStack_1500;
              auVar121._12_4_ = auVar53._12_4_ * fVar69 + fVar130 * fStack_14fc;
              local_14f8._0_4_ = auVar60._0_4_;
              local_14f8._4_4_ = auVar60._4_4_;
              fStack_14f0 = auVar60._8_4_;
              fStack_14ec = auVar60._12_4_;
              auVar52._0_4_ = fVar91 * (float)local_14f8._0_4_ + auVar86._0_4_ * fVar58;
              auVar52._4_4_ = fVar128 * (float)local_14f8._4_4_ + auVar86._4_4_ * fVar67;
              auVar52._8_4_ = fVar129 * fStack_14f0 + auVar86._8_4_ * fVar68;
              auVar52._12_4_ = fVar130 * fStack_14ec + auVar86._12_4_ * fVar69;
              local_13b8 = *puVar2;
              uStack_13b0 = puVar2[1];
              auVar51 = vsubps_avx(auVar123,auVar59);
              auVar54 = vsubps_avx(_local_1478,auVar73);
              auVar92 = vsubps_avx(auVar101,auVar111);
              auVar71 = vsubps_avx(auVar119,auVar123);
              auVar72 = vsubps_avx(auVar121,_local_1478);
              auVar93 = vsubps_avx(auVar52,auVar101);
              fVar69 = auVar93._0_4_;
              fVar105 = auVar54._0_4_;
              auVar53._0_4_ = fVar105 * fVar69;
              fVar8 = auVar93._4_4_;
              fVar107 = auVar54._4_4_;
              auVar53._4_4_ = fVar107 * fVar8;
              fVar13 = auVar93._8_4_;
              fVar108 = auVar54._8_4_;
              auVar53._8_4_ = fVar108 * fVar13;
              fVar18 = auVar93._12_4_;
              fVar109 = auVar54._12_4_;
              auVar53._12_4_ = fVar109 * fVar18;
              fVar91 = auVar72._0_4_;
              fVar110 = auVar92._0_4_;
              auVar60._0_4_ = fVar110 * fVar91;
              fVar9 = auVar72._4_4_;
              fVar113 = auVar92._4_4_;
              auVar60._4_4_ = fVar113 * fVar9;
              fVar14 = auVar72._8_4_;
              fVar115 = auVar92._8_4_;
              auVar60._8_4_ = fVar115 * fVar14;
              fVar19 = auVar72._12_4_;
              fVar117 = auVar92._12_4_;
              auVar60._12_4_ = fVar117 * fVar19;
              local_14e8 = vsubps_avx(auVar60,auVar53);
              fVar128 = auVar71._0_4_;
              auVar61._0_4_ = fVar110 * fVar128;
              fVar10 = auVar71._4_4_;
              auVar61._4_4_ = fVar113 * fVar10;
              fVar15 = auVar71._8_4_;
              auVar61._8_4_ = fVar115 * fVar15;
              fVar20 = auVar71._12_4_;
              auVar61._12_4_ = fVar117 * fVar20;
              fVar129 = auVar51._0_4_;
              auVar74._0_4_ = fVar69 * fVar129;
              fVar11 = auVar51._4_4_;
              auVar74._4_4_ = fVar8 * fVar11;
              fVar16 = auVar51._8_4_;
              auVar74._8_4_ = fVar13 * fVar16;
              fVar21 = auVar51._12_4_;
              auVar74._12_4_ = fVar18 * fVar21;
              local_12f8 = vsubps_avx(auVar74,auVar61);
              auVar95 = ZEXT1664(local_12f8);
              auVar75._0_4_ = fVar91 * fVar129;
              auVar75._4_4_ = fVar9 * fVar11;
              auVar75._8_4_ = fVar14 * fVar16;
              auVar75._12_4_ = fVar19 * fVar21;
              auVar86._0_4_ = fVar105 * fVar128;
              auVar86._4_4_ = fVar107 * fVar10;
              auVar86._8_4_ = fVar108 * fVar15;
              auVar86._12_4_ = fVar109 * fVar20;
              _local_1488 = vsubps_avx(auVar86,auVar75);
              auVar90 = ZEXT1664(_local_1488);
              uVar4 = *(undefined4 *)&(ray->org).field_0;
              auVar54._4_4_ = uVar4;
              auVar54._0_4_ = uVar4;
              auVar54._8_4_ = uVar4;
              auVar54._12_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar125._4_4_ = uVar4;
              auVar125._0_4_ = uVar4;
              auVar125._8_4_ = uVar4;
              auVar125._12_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar131._4_4_ = uVar4;
              auVar131._0_4_ = uVar4;
              auVar131._8_4_ = uVar4;
              auVar131._12_4_ = uVar4;
              fVar58 = (ray->dir).field_0.m128[1];
              _local_14f8 = vsubps_avx(auVar123,auVar54);
              fVar67 = (ray->dir).field_0.m128[2];
              _local_1508 = vsubps_avx(_local_1478,auVar125);
              _local_1468 = vsubps_avx(auVar101,auVar131);
              fVar130 = local_1468._0_4_;
              auVar102._0_4_ = fVar58 * fVar130;
              fVar12 = local_1468._4_4_;
              auVar102._4_4_ = fVar58 * fVar12;
              fVar17 = local_1468._8_4_;
              auVar102._8_4_ = fVar58 * fVar17;
              fVar22 = local_1468._12_4_;
              auVar102._12_4_ = fVar58 * fVar22;
              fVar96 = local_1508._0_4_;
              auVar126._0_4_ = fVar96 * fVar67;
              fVar98 = local_1508._4_4_;
              auVar126._4_4_ = fVar98 * fVar67;
              fVar99 = local_1508._8_4_;
              auVar126._8_4_ = fVar99 * fVar67;
              fVar100 = local_1508._12_4_;
              auVar126._12_4_ = fVar100 * fVar67;
              auVar54 = vsubps_avx(auVar126,auVar102);
              fVar68 = (ray->dir).field_0.m128[0];
              fVar70 = local_14f8._0_4_;
              auVar132._0_4_ = fVar70 * fVar67;
              fVar83 = local_14f8._4_4_;
              auVar132._4_4_ = fVar83 * fVar67;
              fVar84 = local_14f8._8_4_;
              auVar132._8_4_ = fVar84 * fVar67;
              fVar85 = local_14f8._12_4_;
              auVar132._12_4_ = fVar85 * fVar67;
              auVar62._0_4_ = fVar68 * fVar130;
              auVar62._4_4_ = fVar68 * fVar12;
              auVar62._8_4_ = fVar68 * fVar17;
              auVar62._12_4_ = fVar68 * fVar22;
              auVar92 = vsubps_avx(auVar62,auVar132);
              auVar133._0_4_ = fVar68 * fVar96;
              auVar133._4_4_ = fVar68 * fVar98;
              auVar133._8_4_ = fVar68 * fVar99;
              auVar133._12_4_ = fVar68 * fVar100;
              auVar76._0_4_ = fVar58 * fVar70;
              auVar76._4_4_ = fVar58 * fVar83;
              auVar76._8_4_ = fVar58 * fVar84;
              auVar76._12_4_ = fVar58 * fVar85;
              auVar71 = vsubps_avx(auVar76,auVar133);
              auVar72 = _local_1488;
              auVar55._0_4_ =
                   local_14e8._0_4_ * fVar68 + fVar58 * local_12f8._0_4_ + local_1488._0_4_ * fVar67
              ;
              auVar55._4_4_ =
                   local_14e8._4_4_ * fVar68 + fVar58 * local_12f8._4_4_ + local_1488._4_4_ * fVar67
              ;
              auVar55._8_4_ =
                   local_14e8._8_4_ * fVar68 + fVar58 * local_12f8._8_4_ + local_1488._8_4_ * fVar67
              ;
              auVar55._12_4_ =
                   local_14e8._12_4_ * fVar68 +
                   fVar58 * local_12f8._12_4_ + local_1488._12_4_ * fVar67;
              auVar77._8_8_ = 0x8000000080000000;
              auVar77._0_8_ = 0x8000000080000000;
              auVar51 = vandps_avx(auVar55,auVar77);
              uVar48 = auVar51._0_4_;
              local_1398._0_4_ =
                   (float)(uVar48 ^ (uint)(fVar128 * auVar54._0_4_ +
                                          fVar91 * auVar92._0_4_ + fVar69 * auVar71._0_4_));
              uVar114 = auVar51._4_4_;
              local_1398._4_4_ =
                   (float)(uVar114 ^
                          (uint)(fVar10 * auVar54._4_4_ +
                                fVar9 * auVar92._4_4_ + fVar8 * auVar71._4_4_));
              uVar116 = auVar51._8_4_;
              local_1398._8_4_ =
                   (float)(uVar116 ^
                          (uint)(fVar15 * auVar54._8_4_ +
                                fVar14 * auVar92._8_4_ + fVar13 * auVar71._8_4_));
              uVar118 = auVar51._12_4_;
              local_1398._12_4_ =
                   (float)(uVar118 ^
                          (uint)(fVar20 * auVar54._12_4_ +
                                fVar19 * auVar92._12_4_ + fVar18 * auVar71._12_4_));
              local_1388._0_4_ =
                   (float)(uVar48 ^ (uint)(fVar129 * auVar54._0_4_ +
                                          fVar105 * auVar92._0_4_ + fVar110 * auVar71._0_4_));
              local_1388._4_4_ =
                   (float)(uVar114 ^
                          (uint)(fVar11 * auVar54._4_4_ +
                                fVar107 * auVar92._4_4_ + fVar113 * auVar71._4_4_));
              local_1388._8_4_ =
                   (float)(uVar116 ^
                          (uint)(fVar16 * auVar54._8_4_ +
                                fVar108 * auVar92._8_4_ + fVar115 * auVar71._8_4_));
              local_1388._12_4_ =
                   (float)(uVar118 ^
                          (uint)(fVar21 * auVar54._12_4_ +
                                fVar109 * auVar92._12_4_ + fVar117 * auVar71._12_4_));
              auVar92 = ZEXT416(0) << 0x20;
              auVar51 = vcmpps_avx(local_1398,auVar92,5);
              auVar54 = vcmpps_avx(local_1388,auVar92,5);
              auVar51 = vandps_avx(auVar51,auVar54);
              auVar78._8_4_ = 0x7fffffff;
              auVar78._0_8_ = 0x7fffffff7fffffff;
              auVar78._12_4_ = 0x7fffffff;
              auVar82 = ZEXT1664(auVar78);
              local_1368 = vandps_avx(auVar55,auVar78);
              auVar54 = vcmpps_avx(auVar92,auVar55,4);
              auVar51 = vandps_avx(auVar51,auVar54);
              auVar63._0_4_ = local_1398._0_4_ + local_1388._0_4_;
              auVar63._4_4_ = local_1398._4_4_ + local_1388._4_4_;
              auVar63._8_4_ = local_1398._8_4_ + local_1388._8_4_;
              auVar63._12_4_ = local_1398._12_4_ + local_1388._12_4_;
              auVar54 = vcmpps_avx(auVar63,local_1368,2);
              auVar66 = ZEXT1664(auVar54);
              auVar51 = vandps_avx(auVar51,auVar54);
              auVar54 = auVar30 & auVar51;
              if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar54[0xf] < '\0') {
                auVar51 = vandps_avx(auVar51,auVar30);
                local_1378._0_4_ =
                     (float)(uVar48 ^ (uint)(local_14e8._0_4_ * fVar70 +
                                            local_12f8._0_4_ * fVar96 + fVar130 * local_1488._0_4_))
                ;
                local_1378._4_4_ =
                     (float)(uVar114 ^
                            (uint)(local_14e8._4_4_ * fVar83 +
                                  local_12f8._4_4_ * fVar98 + fVar12 * local_1488._4_4_));
                local_1378._8_4_ =
                     (float)(uVar116 ^
                            (uint)(local_14e8._8_4_ * fVar84 +
                                  local_12f8._8_4_ * fVar99 + fVar17 * local_1488._8_4_));
                local_1378._12_4_ =
                     (float)(uVar118 ^
                            (uint)(local_14e8._12_4_ * fVar85 +
                                  local_12f8._12_4_ * fVar100 + fVar22 * local_1488._12_4_));
                auVar90 = ZEXT1664(local_1378);
                fVar58 = (ray->org).field_0.m128[3];
                fVar67 = local_1368._0_4_;
                auVar56._0_4_ = fVar67 * fVar58;
                fVar68 = local_1368._4_4_;
                auVar56._4_4_ = fVar68 * fVar58;
                fVar69 = local_1368._8_4_;
                auVar56._8_4_ = fVar69 * fVar58;
                fVar91 = local_1368._12_4_;
                auVar56._12_4_ = fVar91 * fVar58;
                auVar54 = vcmpps_avx(auVar56,local_1378,1);
                fVar58 = ray->tfar;
                auVar64._0_4_ = fVar67 * fVar58;
                auVar64._4_4_ = fVar68 * fVar58;
                auVar64._8_4_ = fVar69 * fVar58;
                auVar64._12_4_ = fVar91 * fVar58;
                auVar92 = vcmpps_avx(local_1378,auVar64,2);
                auVar66 = ZEXT1664(auVar92);
                auVar54 = vandps_avx(auVar92,auVar54);
                auVar95 = ZEXT1664(auVar54);
                auVar92 = auVar51 & auVar54;
                if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar92[0xf] < '\0') {
                  local_1348 = vandps_avx(auVar51,auVar54);
                  local_1308 = local_14e8;
                  local_12e8 = local_1488;
                  uStack_12e0 = uStack_1480;
                  auVar51 = vrcpps_avx(local_1368);
                  fVar58 = auVar51._0_4_;
                  auVar79._0_4_ = fVar67 * fVar58;
                  fVar67 = auVar51._4_4_;
                  auVar79._4_4_ = fVar68 * fVar67;
                  fVar68 = auVar51._8_4_;
                  auVar79._8_4_ = fVar69 * fVar68;
                  fVar69 = auVar51._12_4_;
                  auVar79._12_4_ = fVar91 * fVar69;
                  auVar87._8_4_ = 0x3f800000;
                  auVar87._0_8_ = &DAT_3f8000003f800000;
                  auVar87._12_4_ = 0x3f800000;
                  auVar90 = ZEXT1664(auVar87);
                  auVar51 = vsubps_avx(auVar87,auVar79);
                  fVar58 = fVar58 + fVar58 * auVar51._0_4_;
                  fVar67 = fVar67 + fVar67 * auVar51._4_4_;
                  fVar68 = fVar68 + fVar68 * auVar51._8_4_;
                  fVar69 = fVar69 + fVar69 * auVar51._12_4_;
                  local_1318[0] = fVar58 * local_1378._0_4_;
                  local_1318[1] = fVar67 * local_1378._4_4_;
                  local_1318[2] = fVar68 * local_1378._8_4_;
                  local_1318[3] = fVar69 * local_1378._12_4_;
                  local_1338._0_4_ = fVar58 * local_1398._0_4_;
                  local_1338._4_4_ = fVar67 * local_1398._4_4_;
                  local_1338._8_4_ = fVar68 * local_1398._8_4_;
                  local_1338._12_4_ = fVar69 * local_1398._12_4_;
                  auVar82 = ZEXT1664(local_1338);
                  local_1328._0_4_ = fVar58 * local_1388._0_4_;
                  local_1328._4_4_ = fVar67 * local_1388._4_4_;
                  local_1328._8_4_ = fVar68 * local_1388._8_4_;
                  local_1328._12_4_ = fVar69 * local_1388._12_4_;
                  auVar66 = ZEXT1664(local_1328);
                  uVar48 = vmovmskps_avx(local_1348);
                  uVar39 = (ulong)uVar48;
                  _local_1488 = auVar72;
                  do {
                    uVar40 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                      }
                    }
                    h.geomID = *(uint *)((long)&local_13a8 + uVar40 * 4);
                    pGVar6 = (scene->geometries).items[h.geomID].ptr;
                    if ((pGVar6->mask & ray->mask) == 0) {
                      uVar39 = uVar39 ^ 1L << (uVar40 & 0x3f);
                      bVar29 = true;
                    }
                    else {
                      pRVar7 = context->args;
                      if ((pRVar7->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar29 = false;
                      }
                      else {
                        auVar66 = ZEXT464((uint)local_1318[uVar40 - 4]);
                        args.context = context->user;
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1308 + uVar40 * 4);
                        auVar82 = ZEXT464((uint)h.Ng.field_0.field_0.x);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_12f8 + uVar40 * 4);
                        auVar90 = ZEXT464((uint)h.Ng.field_0.field_0.y);
                        h.Ng.field_0.field_0.z = *(float *)((long)&local_12e8 + uVar40 * 4);
                        auVar95 = ZEXT464((uint)h.Ng.field_0.field_0.z);
                        h.u = *(float *)(local_1338 + uVar40 * 4);
                        h.v = local_1318[uVar40 - 4];
                        h.primID = *(uint *)((long)&local_13b8 + uVar40 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_14e8._0_4_ = ray->tfar;
                        ray->tfar = local_1318[uVar40];
                        local_150c = -1;
                        args.valid = &local_150c;
                        args.geometryUserPtr = pGVar6->userPtr;
                        args.ray = (RTCRayN *)ray;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00308536:
                          if (pRVar7->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              auVar82 = ZEXT1664(auVar82._0_16_);
                              auVar90 = ZEXT1664(auVar90._0_16_);
                              auVar95 = ZEXT1664(auVar95._0_16_);
                              (*pRVar7->filter)(&args);
                              auVar66._8_56_ = extraout_var_00;
                              auVar66._0_8_ = extraout_XMM1_Qa_00;
                            }
                            if (*args.valid == 0) goto LAB_00308569;
                          }
                          bVar29 = false;
                        }
                        else {
                          auVar82 = ZEXT464((uint)h.Ng.field_0.field_0.x);
                          auVar90 = ZEXT464((uint)h.Ng.field_0.field_0.y);
                          auVar95 = ZEXT464((uint)h.Ng.field_0.field_0.z);
                          (*pGVar6->occlusionFilterN)(&args);
                          auVar66._8_56_ = extraout_var;
                          auVar66._0_8_ = extraout_XMM1_Qa;
                          if (*args.valid != 0) goto LAB_00308536;
LAB_00308569:
                          ray->tfar = (float)local_14e8._0_4_;
                          uVar39 = uVar39 ^ 1L << (uVar40 & 0x3f);
                          bVar29 = true;
                        }
                      }
                    }
                    if (!bVar29) {
                      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar103 = ZEXT3264(local_11f8);
                      auVar104 = ZEXT3264(local_1218);
                      auVar106 = ZEXT3264(local_1238);
                      auVar112 = ZEXT3264(local_1258);
                      auVar120 = ZEXT3264(local_1278);
                      auVar122 = ZEXT3264(local_1298);
                      auVar124 = ZEXT3264(local_12b8);
                      auVar127 = ZEXT3264(local_12d8);
                      iVar37 = 0;
                      uVar36 = local_14c8;
                      uVar45 = local_14a8;
                      uVar39 = local_14b0;
                      uVar40 = local_14b8;
                      uVar42 = local_14c0;
                      uVar46 = local_14d0;
                      if (bVar50) {
                        ray->tfar = -INFINITY;
                        iVar37 = 3;
                      }
                      goto LAB_0030860c;
                    }
                  } while (uVar39 != 0);
                }
              }
              uVar36 = uVar36 + 1;
              bVar50 = uVar36 < local_1458;
              auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
            } while (uVar36 != local_1458);
            auVar103 = ZEXT3264(local_11f8);
            auVar104 = ZEXT3264(local_1218);
            auVar106 = ZEXT3264(local_1238);
            auVar112 = ZEXT3264(local_1258);
            auVar120 = ZEXT3264(local_1278);
            auVar122 = ZEXT3264(local_1298);
            auVar124 = ZEXT3264(local_12b8);
            auVar127 = ZEXT3264(local_12d8);
            iVar37 = 0;
            uVar36 = local_14c8;
            uVar45 = local_14a8;
            uVar39 = local_14b0;
            uVar40 = local_14b8;
            uVar42 = local_14c0;
            uVar46 = local_14d0;
          }
        }
LAB_0030860c:
        unaff_R12 = local_14a0;
      } while (iVar37 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }